

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_write(PgHdr *pPg)

{
  ushort uVar1;
  Pgno PVar2;
  Pager *pPager;
  void *pvVar3;
  sqlite3_file *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_vfs *psVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined8 in_RAX;
  Bitvec *pBVar11;
  MemJournal *p;
  long lVar12;
  ulong uVar13;
  Pager *pPg_00;
  u32 cksum;
  u32 uVar14;
  undefined8 local_38;
  
  pPager = pPg->pPager;
  if (pPager->errCode != 0) {
    return pPager->errCode;
  }
  if (pPager->readOnly != '\0') {
    return 3;
  }
  pvVar3 = pPg->pData;
  local_38 = in_RAX;
  if (pPager->eState == '\x02') {
    if ((pPager->pWal == (Wal *)0x0) && (pPager->journalMode != '\x02')) {
      psVar6 = pPager->pVfs;
      PVar2 = pPager->dbSize;
      pBVar11 = (Bitvec *)sqlite3Malloc(0x200);
      if (pBVar11 == (Bitvec *)0x0) {
        pPager->pInJournal = (Bitvec *)0x0;
        return 7;
      }
      memset(&pBVar11->nSet,0,0x1fc);
      pBVar11->iSize = PVar2;
      pPager->pInJournal = pBVar11;
      psVar4 = pPager->jfd;
      if (psVar4->pMethods == (sqlite3_io_methods *)0x0) {
        if (pPager->journalMode == '\x04') {
          psVar4[3].pMethods = (sqlite3_io_methods *)0x0;
          psVar4[4].pMethods = (sqlite3_io_methods *)0x0;
          psVar4[1].pMethods = (sqlite3_io_methods *)0x0;
          psVar4[2].pMethods = (sqlite3_io_methods *)0x0;
          psVar4[5].pMethods = (sqlite3_io_methods *)0x0;
          psVar4->pMethods = &MemJournalMethods;
        }
        else {
          iVar8 = 0x100e;
          if (pPager->tempFile == '\0') {
            iVar8 = 0x806;
          }
          iVar8 = (*psVar6->xOpen)(psVar6,pPager->zJournal,psVar4,iVar8,(int *)0x0);
          if (iVar8 != 0) goto LAB_00132f99;
        }
      }
      pPager->nRec = 0;
      pPager->setMaster = '\0';
      pPager->journalOff = 0;
      pPager->journalHdr = 0;
      iVar8 = writeJournalHdr(pPager);
      if (iVar8 != 0) {
LAB_00132f99:
        sqlite3BitvecDestroy(pPager->pInJournal);
        pPager->pInJournal = (Bitvec *)0x0;
        return iVar8;
      }
    }
    pPager->eState = '\x03';
  }
  uVar1 = pPg->flags;
  uVar7 = uVar1 & 0xffdf;
  pPg->flags = uVar7;
  if ((uVar1 & 2) == 0) {
    pPg->flags = uVar7 | 2;
    pcacheAddToDirtyList(pPg);
  }
  pPg_00 = pPg->pPager;
  uVar9 = pPg->pgno;
  iVar8 = sqlite3BitvecTest(pPg_00->pInJournal,uVar9);
  if (iVar8 == 0) {
    if (pPager->pWal == (Wal *)0x0) {
      if (uVar9 <= pPager->dbOrigSize) {
        psVar4 = pPager->jfd;
        psVar5 = psVar4->pMethods;
        if (psVar5 != (sqlite3_io_methods *)0x0) {
          lVar12 = pPager->journalOff;
          uVar14 = pPager->cksumInit;
          if (200 < (long)pPager->pageSize) {
            uVar13 = (long)pPager->pageSize + 200;
            do {
              uVar14 = uVar14 + *(byte *)((long)pvVar3 + (uVar13 - 400));
              uVar13 = uVar13 - 200;
            } while (400 < uVar13);
          }
          *(byte *)&pPg->flags = (byte)pPg->flags | 4;
          local_38 = CONCAT44(local_38._4_4_,
                              uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                              uVar9 << 0x18);
          iVar8 = (*psVar5->xWrite)(psVar4,&local_38,4,lVar12);
          if (iVar8 != 0) {
            return iVar8;
          }
          lVar12 = lVar12 + 4;
          iVar8 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,pvVar3,pPager->pageSize,lVar12);
          if (iVar8 != 0) {
            return iVar8;
          }
          local_38 = CONCAT44(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                              uVar14 << 0x18,(undefined4)local_38);
          iVar8 = (*pPager->jfd->pMethods->xWrite)
                            (pPager->jfd,(void *)((long)&local_38 + 4),4,lVar12 + pPager->pageSize);
          if (iVar8 != 0) {
            return iVar8;
          }
          pPager->journalOff = (long)pPager->pageSize + pPager->journalOff + 8;
          pPager->nRec = pPager->nRec + 1;
          uVar9 = sqlite3BitvecSet(pPager->pInJournal,pPg->pgno);
          uVar10 = addToSavepointBitvecs(pPager,pPg->pgno);
          if ((uVar10 | uVar9) != 0) {
            return uVar10 | uVar9;
          }
          pPg_00 = pPg->pPager;
          uVar9 = pPg->pgno;
          goto LAB_00132dc7;
        }
      }
      if (pPager->eState != '\x04') {
        *(byte *)&pPg->flags = (byte)pPg->flags | 4;
      }
    }
LAB_00132dc7:
    iVar8 = subjRequiresPage((PgHdr *)pPg_00);
    if (iVar8 != 0) {
      iVar8 = subjournalPage(pPg);
      uVar9 = pPg->pgno;
      goto LAB_00132de9;
    }
  }
  else {
    iVar8 = subjRequiresPage((PgHdr *)pPg_00);
    if (iVar8 != 0) goto LAB_00132dc7;
  }
  iVar8 = 0;
LAB_00132de9:
  if (pPager->dbSize < uVar9) {
    pPager->dbSize = uVar9;
  }
  return iVar8;
}

Assistant:

static int pager_write(PgHdr *pPg){
  void *pData = pPg->pData;
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );

  /* If an error has been previously detected, report the same error
  ** again. This should not happen, but the check provides robustness. */
  if( NEVER(pPager->errCode) )  return pPager->errCode;

  /* Higher-level routines never call this function if database is not
  ** writable.  But check anyway, just for robustness. */
  if( NEVER(pPager->readOnly) ) return SQLITE_PERM;

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  if( pageInJournal(pPg) && !subjRequiresPage(pPg) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !pageInJournal(pPg) && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}